

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ack_message_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::AckMessageTest_TestEncode_Test::TestBody
          (AckMessageTest_TestEncode_Test *this)

{
  bool bVar1;
  char *message;
  uint32_t in_ECX;
  AssertHelper local_90;
  Message local_88 [3];
  string local_70;
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  ByteBuffer buffer;
  AckMessageTest_TestEncode_Test *this_local;
  
  bidfx_public_api::price::pixie::AckMessage::Encode((int)&gtest_ar.message_);
  tools::HexEncoderDecoder::StreamAsHex_abi_cxx11_
            (&local_70,(HexEncoderDecoder *)&gtest_ar.message_,(ByteBuffer *)0x18,in_ECX);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_50,"kEncodedMessageV2",
             "HexEncoderDecoder::StreamAsHex(buffer, 24)",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             kEncodedMessageV2_abi_cxx11_,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(local_88);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/ack_message_test.cpp"
               ,0x28,message);
    testing::internal::AssertHelper::operator=(&local_90,local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::Message::~Message(local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer((ByteBuffer *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(AckMessageTest, TestEncode)
{
    ByteBuffer buffer = ackMessage.Encode(3);
    ASSERT_EQ(kEncodedMessageV2, HexEncoderDecoder::StreamAsHex(buffer, 24));
}